

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

void __thiscall
lscpp::stdio_transporter::stdio_transporter(stdio_transporter *this,bool log_communication)

{
  char *__p;
  comm_logger local_30;
  undefined1 local_11;
  stdio_transporter *psStack_10;
  bool log_communication_local;
  stdio_transporter *this_local;
  
  local_11 = log_communication;
  psStack_10 = this;
  if (log_communication) {
    memset(&local_30,0,0x18);
    comm_logger::comm_logger(&local_30);
    std::optional<lscpp::comm_logger>::optional<lscpp::comm_logger,_true>
              (&this->comm_logger_,&local_30);
    comm_logger::~comm_logger(&local_30);
  }
  else {
    std::optional<lscpp::comm_logger>::optional(&this->comm_logger_);
  }
  this->size_ = 0x400;
  __p = (char *)operator_new__(this->size_);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data_,__p);
  return;
}

Assistant:

stdio_transporter::stdio_transporter(bool log_communication)
    : comm_logger_{log_communication ? std::optional<comm_logger>{comm_logger{}}
                                     : std::nullopt} {}